

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# compositecodec.h
# Opt level: O2

void __thiscall
FastPForLib::
CompositeCodec<FastPForLib::OPTPFor<4U,_FastPForLib::Simple16<false>_>,_FastPForLib::VariableByte>::
_encodeArray<unsigned_long>
          (CompositeCodec<FastPForLib::OPTPFor<4U,_FastPForLib::Simple16<false>_>,_FastPForLib::VariableByte>
           *this,unsigned_long *in,size_t length,uint32_t *out,size_t *nvalue)

{
  logic_error *this_00;
  ulong uVar1;
  size_t nvalue1;
  size_t nvalue2;
  
  nvalue1 = *nvalue;
  if (nvalue1 != 0) {
    uVar1 = length & 0xffffffffffffff80;
    IntegerCODEC::encodeArray((IntegerCODEC *)&this->codec1,in,uVar1,out,&nvalue1);
    if (uVar1 != length) {
      nvalue2 = *nvalue - nvalue1;
      if (*nvalue < nvalue1) {
        this_00 = (logic_error *)__cxa_allocate_exception(0x10);
        std::logic_error::logic_error
                  (this_00,"Encode run over output buffer. Potential buffer overflow!");
        __cxa_throw(this_00,&std::logic_error::typeinfo,std::logic_error::~logic_error);
      }
      VariableByte::_encodeArray<unsigned_long>
                (&this->codec2,in + uVar1,(ulong)((uint)length & 0x7f),out + nvalue1,&nvalue2);
      nvalue1 = nvalue2 + nvalue1;
    }
    *nvalue = nvalue1;
  }
  return;
}

Assistant:

void _encodeArray(const IntType *in, const size_t length, uint32_t *out,
                    size_t &nvalue) {
    if (nvalue == 0) {
      return;
    }
    const size_t roundedlength = length / Codec1::BlockSize * Codec1::BlockSize;
    size_t nvalue1 = nvalue;
    codec1.encodeArray(in, roundedlength, out, nvalue1);

    if (roundedlength < length) {
      if (nvalue1 > nvalue) {
        throw std::logic_error(
            "Encode run over output buffer. Potential buffer overflow!");
      }
      size_t nvalue2 = nvalue - nvalue1;
      codec2.encodeArray(in + roundedlength, length - roundedlength,
                         out + nvalue1, nvalue2);
      nvalue = nvalue1 + nvalue2;
    } else {
      nvalue = nvalue1;
    }
  }